

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t http2_handle_stream_close(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream,CURLcode *err)

{
  undefined1 *puVar1;
  dynhds *dynhds;
  uint32_t error_code;
  uint uVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  dynhds_entry *pdVar6;
  size_t sVar7;
  dynbuf dbuf;
  dynbuf local_50;
  
  error_code = stream->error;
  if (error_code != 0) {
    if (error_code == 7) {
      if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
          ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] REFUSED_STREAM, try again on a new connection",
                          (ulong)(uint)stream->id);
      }
      Curl_conncontrol(cf->conn,1);
      puVar1 = &(data->state).field_0x74c;
      *puVar1 = *puVar1 | 4;
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    uVar2 = stream->id;
    pcVar4 = nghttp2_http2_strerror(error_code);
    Curl_failf(data,"HTTP/2 stream %u was not closed cleanly: %s (err %u)",(ulong)uVar2,pcVar4,
               (ulong)stream->error);
LAB_005e93b9:
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }
  if (stream->reset == true) {
    Curl_failf(data,"HTTP/2 stream %u was reset",(ulong)(uint)stream->id);
    CVar3 = CURLE_RECV_ERROR;
    if (stream->bodystarted != false) {
      CVar3 = CURLE_PARTIAL_FILE;
    }
    *err = CVar3;
    return -1;
  }
  if (stream->bodystarted == false) {
    Curl_failf(data,
               "HTTP/2 stream %u was closed cleanly, but before getting  all response header fields, treated as error"
               ,(ulong)(uint)stream->id);
    goto LAB_005e93b9;
  }
  dynhds = &stream->resp_trailers;
  sVar5 = Curl_dynhds_count(dynhds);
  if (sVar5 != 0) {
    *err = CURLE_OK;
    Curl_dyn_init(&local_50,0x10000);
    sVar5 = Curl_dynhds_count(dynhds);
    if (sVar5 != 0) {
      sVar5 = 0;
      do {
        pdVar6 = Curl_dynhds_getn(dynhds,sVar5);
        if (pdVar6 == (dynhds_entry *)0x0) break;
        Curl_dyn_reset(&local_50);
        CVar3 = Curl_dyn_addf(&local_50,"%.*s: %.*s\r\n",(ulong)(uint)pdVar6->namelen,pdVar6->name,
                              (ulong)(uint)pdVar6->valuelen,pdVar6->value);
        *err = CVar3;
        if (CVar3 != CURLE_OK) break;
        pcVar4 = Curl_dyn_ptr(&local_50);
        sVar7 = Curl_dyn_len(&local_50);
        Curl_debug(data,CURLINFO_HEADER_IN,pcVar4,sVar7);
        pcVar4 = Curl_dyn_ptr(&local_50);
        sVar7 = Curl_dyn_len(&local_50);
        CVar3 = Curl_client_write(data,0x44,pcVar4,sVar7);
        *err = CVar3;
        if (CVar3 != CURLE_OK) break;
        sVar5 = sVar5 + 1;
        sVar7 = Curl_dynhds_count(dynhds);
      } while (sVar5 < sVar7);
    }
    Curl_dyn_free(&local_50);
    if (*err != CURLE_OK) goto LAB_005e9362;
  }
  stream->close_handled = true;
  *err = CURLE_OK;
LAB_005e9362:
  if (data != (Curl_easy *)0x0) {
    if (cf == (Curl_cfilter *)0x0) {
      return 0;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return 0;
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"handle_stream_close -> %zd, %d",0,(ulong)*err);
      return 0;
    }
  }
  return 0;
}

Assistant:

static ssize_t http2_handle_stream_close(struct Curl_cfilter *cf,
                                         struct Curl_easy *data,
                                         struct stream_ctx *stream,
                                         CURLcode *err)
{
  ssize_t rv = 0;

  if(stream->error == NGHTTP2_REFUSED_STREAM) {
    CURL_TRC_CF(data, cf, "[%d] REFUSED_STREAM, try again on a new "
                "connection", stream->id);
    connclose(cf->conn, "REFUSED_STREAM"); /* don't use this anymore */
    data->state.refused_stream = TRUE;
    *err = CURLE_RECV_ERROR; /* trigger Curl_retry_request() later */
    return -1;
  }
  else if(stream->error != NGHTTP2_NO_ERROR) {
    failf(data, "HTTP/2 stream %u was not closed cleanly: %s (err %u)",
          stream->id, nghttp2_http2_strerror(stream->error),
          stream->error);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }
  else if(stream->reset) {
    failf(data, "HTTP/2 stream %u was reset", stream->id);
    *err = stream->bodystarted? CURLE_PARTIAL_FILE : CURLE_RECV_ERROR;
    return -1;
  }

  if(!stream->bodystarted) {
    failf(data, "HTTP/2 stream %u was closed cleanly, but before getting "
          " all response header fields, treated as error",
          stream->id);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(Curl_dynhds_count(&stream->resp_trailers)) {
    struct dynhds_entry *e;
    struct dynbuf dbuf;
    size_t i;

    *err = CURLE_OK;
    Curl_dyn_init(&dbuf, DYN_TRAILERS);
    for(i = 0; i < Curl_dynhds_count(&stream->resp_trailers); ++i) {
      e = Curl_dynhds_getn(&stream->resp_trailers, i);
      if(!e)
        break;
      Curl_dyn_reset(&dbuf);
      *err = Curl_dyn_addf(&dbuf, "%.*s: %.*s\x0d\x0a",
                          (int)e->namelen, e->name,
                          (int)e->valuelen, e->value);
      if(*err)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, Curl_dyn_ptr(&dbuf),
                 Curl_dyn_len(&dbuf));
      *err = Curl_client_write(data, CLIENTWRITE_HEADER|CLIENTWRITE_TRAILER,
                               Curl_dyn_ptr(&dbuf), Curl_dyn_len(&dbuf));
      if(*err)
        break;
    }
    Curl_dyn_free(&dbuf);
    if(*err)
      goto out;
  }

  stream->close_handled = TRUE;
  *err = CURLE_OK;
  rv = 0;

out:
  CURL_TRC_CF(data, cf, "handle_stream_close -> %zd, %d", rv, *err);
  return rv;
}